

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeDisplay.cpp
# Opt level: O3

void * __thiscall eglu::NativeDisplay::getPlatformNative(NativeDisplay *this)

{
  Capability CVar1;
  NotSupportedError *this_00;
  pointer_____offset_0x10___ *ppuVar2;
  
  CVar1 = this->m_capabilities;
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  if ((CVar1 & CAPABILITY_GET_DISPLAY_PLATFORM) == 0) {
    tcu::NotSupportedError::NotSupportedError
              (this_00,"eglu::NativeDisplay can\'t be used with eglGetPlatformDisplay()",(char *)0x0
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeDisplay.cpp"
               ,0x45);
    ppuVar2 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    tcu::InternalError::InternalError
              ((InternalError *)this_00,(char *)0x0,
               "(m_capabilities & CAPABILITY_GET_DISPLAY_PLATFORM) == 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeDisplay.cpp"
               ,0x44);
    ppuVar2 = &tcu::InternalError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar2,tcu::Exception::~Exception);
}

Assistant:

void* NativeDisplay::getPlatformNative (void)
{
	// If NativeDisplay claims to support CAPABILITY_GET_DISPLAY_PLATFORM then
	// this method must be implemented.
	TCU_CHECK_INTERNAL((m_capabilities & CAPABILITY_GET_DISPLAY_PLATFORM) == 0);
	TCU_THROW(NotSupportedError, "eglu::NativeDisplay can't be used with eglGetPlatformDisplay()");
}